

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.c
# Opt level: O1

int func_getargs(void)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  ushort **ppuVar5;
  long lVar6;
  long lVar7;
  byte *pbVar8;
  char *pcVar9;
  int iVar10;
  long lVar11;
  char *pcVar12;
  char (*pacVar13) [80];
  uint uVar14;
  long lVar15;
  byte bVar16;
  long lVar17;
  char *pcVar18;
  ulong local_68;
  
  lVar17 = (long)func_idx;
  if (lVar17 == 7) {
    pcVar12 = "Too many nested function calls!";
  }
  else {
    ppuVar5 = __ctype_b_loc();
    bVar16 = *(byte *)((long)*ppuVar5 + (ulong)*expr * 2 + 1);
    pbVar8 = expr;
    while ((bVar16 & 0x20) != 0) {
      pbVar8 = pbVar8 + 1;
      bVar16 = *(byte *)((long)*ppuVar5 + (ulong)*pbVar8 * 2 + 1);
    }
    expr = pbVar8 + 1;
    if (*pbVar8 != 0x28) {
      return 0;
    }
    pacVar13 = func_arg[lVar17];
    lVar6 = -0x2d0;
    do {
      *(undefined1 *)(lVar17 * 800 + 0x11d6b0 + lVar6) = 0;
      iVar3 = func_idx;
      lVar6 = lVar6 + 0x50;
    } while (lVar6 != 0);
    lVar17 = (long)func_idx;
    pcVar12 = (char *)0x0;
    local_68 = 0;
LAB_0010c852:
    do {
      bVar16 = *(byte *)((long)*ppuVar5 + (ulong)*expr * 2 + 1);
      pbVar8 = expr;
      while ((bVar16 & 0x20) != 0) {
        pbVar8 = pbVar8 + 1;
        bVar16 = *(byte *)((long)*ppuVar5 + (ulong)*pbVar8 * 2 + 1);
      }
      expr = pbVar8 + 1;
      bVar16 = *pbVar8;
      if (bVar16 < 0x2c) {
        if (bVar16 != 0) {
          if (bVar16 == 0x29) {
            return 1;
          }
LAB_0010c8b2:
          lVar6 = 0;
          lVar15 = 0;
          iVar10 = 0;
          bVar1 = false;
          uVar14 = 0;
          bVar2 = false;
          pcVar18 = (char *)expr;
LAB_0010c8c5:
          while (bVar16 == 0) {
            if (!bVar2) goto LAB_0010ca2d;
            expr = (uchar *)(pcVar18 + 1);
            bVar2 = false;
            bVar16 = *pcVar18;
            pcVar18 = (char *)expr;
          }
          if (bVar16 < 0x2c) {
            if (bVar16 == 0x28) {
              iVar10 = iVar10 + 1;
            }
            else if (bVar16 == 0x29) {
              if (iVar10 == 0) goto LAB_0010ca2d;
              iVar10 = iVar10 + -1;
            }
          }
          else if (bVar16 == 0x2c) {
            if (iVar10 == 0) goto LAB_0010ca2d;
          }
          else {
            if (bVar16 == 0x3b) goto LAB_0010ca2d;
            if (bVar16 == 0x5c) {
              if (iVar3 == 0) {
                pcVar12 = "Syntax error!";
                goto LAB_0010c7a3;
              }
              expr = (uchar *)(pcVar18 + 1);
              if ((byte)(*pcVar18 - 0x3aU) < 0xf7) {
                pcVar12 = "Invalid function argument index!";
                goto LAB_0010c7a3;
              }
              pcVar12 = func_arg[lVar17 + -1][(byte)*pcVar18 - 0x31] + 1;
              bVar16 = func_arg[lVar17 + -1][(byte)*pcVar18 - 0x31][0];
              bVar2 = true;
              pcVar18 = (char *)expr;
              goto LAB_0010c8c5;
            }
          }
          if (bVar1) {
            bVar1 = true;
            if (bVar16 != 0x20) {
              lVar11 = (long)(int)uVar14;
              if (lVar11 < lVar15) {
                memset(*(char (*) [80])*pacVar13 + lVar11,0x20,(ulong)(~uVar14 + (int)lVar15) + 1);
                lVar7 = 0;
                do {
                  lVar7 = lVar7 + -1;
                } while (lVar11 + lVar6 != lVar7);
                uVar14 = uVar14 - (int)lVar7;
              }
LAB_0010c9ef:
              lVar11 = (long)(int)uVar14;
              uVar14 = uVar14 + 1;
              (*(char (*) [80])*pacVar13)[lVar11] = bVar16;
              bVar1 = false;
            }
          }
          else {
            bVar1 = true;
            if (bVar16 != 0x20) goto LAB_0010c9ef;
          }
          if (uVar14 == 0x50) {
            pcVar12 = "Invalid function argument length!";
            goto LAB_0010c7a3;
          }
          if (bVar2) {
            pcVar9 = pcVar18;
            pcVar4 = pcVar12 + 1;
            pcVar18 = pcVar12;
          }
          else {
            pcVar9 = pcVar18 + 1;
            pcVar4 = pcVar12;
            expr = (uchar *)pcVar9;
          }
          pcVar12 = pcVar4;
          lVar15 = lVar15 + 1;
          bVar16 = *pcVar18;
          lVar6 = lVar6 + -1;
          pcVar18 = pcVar9;
          goto LAB_0010c8c5;
        }
LAB_0010ca7b:
        pcVar12 = "Syntax error in function call!";
        goto LAB_0010c7a3;
      }
      if (bVar16 != 0x2c) {
        if (bVar16 != 0x3b) goto LAB_0010c8b2;
        goto LAB_0010ca7b;
      }
      uVar14 = (int)local_68 + 1;
      local_68 = (ulong)uVar14;
      pacVar13 = func_arg[lVar17] + local_68;
    } while (uVar14 != 9);
    pcVar12 = "Too many arguments for a function!";
  }
LAB_0010c7a3:
  error(pcVar12);
  return 0;
LAB_0010ca2d:
  (*(char (*) [80])*pacVar13)[(int)uVar14] = '\0';
  expr = expr + -1;
  goto LAB_0010c852;
}

Assistant:

int
func_getargs(void)
{
	char c, *ptr, *line;
	int arg, level, space, flag;
	int i, x;

	/* can not nest too much macros */
	if (func_idx == 7) {
		error("Too many nested function calls!");
		return (0);
	}

	/* skip spaces */
	while (isspace(*expr))
		expr++;

	/* function args must be enclosed in parenthesis */
	if (*expr++ != '(')
		return (0);

	/* initialize args */
    line = NULL;
	ptr  = func_arg[func_idx][0];
	arg  = 0;

	for (i = 0; i < 9; i++)
		func_arg[func_idx][i][0] = '\0';

	/* get args one by one */
	for (;;) {
		/* skip spaces */
		while (isspace(*expr))
			expr++;

		c = *expr++;
		switch (c) {
		/* empty arg */
		case ',':
			arg++;
			ptr = func_arg[func_idx][arg];
			if (arg == 9) {
				error("Too many arguments for a function!");
				return (0);
			}
			break;

		/* end of line */	
		case ';':
		case '\0':
			error("Syntax error in function call!");
			return (0);

		/* end of function */
		case ')':
			return (1);

		/* arg */
		default:
			space = 0;
			level = 0;
			flag = 0;
			i = 0;
			x = 0;
			for (;;) {
				if (c == '\0') {
					if (flag == 0)
						break;
					else {
						flag = 0;
						c = *expr++;
						continue;
					}
				}
				else if (c == ';') {
					break;
				}
				else if (c == ',') {
					if (level == 0)
						break;
				}
				else if (c == '\\') {
					if (func_idx == 0) {
						error("Syntax error!");
						return (0);
					}
					c = *expr++;
					if (c < '1' || c > '9') {
						error("Invalid function argument index!");
						return (0);
					}
					line = func_arg[func_idx - 1][c - '1'];
					flag = 1;
					c = *line++;
					continue;
				}
				else if (c == '(') {
					level++;
				}
				else if (c == ')') {
					if (level == 0)
						break;
					level--;
				}
				if (space) {
					if (c != ' ') {
						while (i < x)
							ptr[i++] = ' ';
						ptr[i++] = c;
						space = 0;
					}
				}
				else if (c == ' ') {
					space = 1;
				}
				else {
					ptr[i++] = c;
				}
				if (i == 80) {
					error("Invalid function argument length!");
					return (0);
				}
				x++;
				if (flag)
					c = *line++;
				else
					c = *expr++;
			}
			ptr[i] = '\0';
			expr--;
			break;
		}
	}
}